

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlParserCtxtPtr htmlCreateDocParserCtxt(xmlChar *cur,char *encoding)

{
  int size;
  xmlCharEncoding enc;
  htmlParserCtxtPtr ctxt;
  xmlChar *pxVar1;
  xmlCharEncodingHandlerPtr handler;
  
  size = xmlStrlen(cur);
  ctxt = htmlCreateMemoryParserCtxt((char *)cur,size);
  if (encoding != (char *)0x0 && ctxt != (htmlParserCtxtPtr)0x0) {
    pxVar1 = ctxt->input->encoding;
    if (pxVar1 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar1);
    }
    pxVar1 = xmlStrdup((xmlChar *)encoding);
    ctxt->input->encoding = pxVar1;
    enc = xmlParseCharEncoding(encoding);
    if (enc == XML_CHAR_ENCODING_ERROR) {
      handler = xmlFindCharEncodingHandler(encoding);
      if (handler != (xmlCharEncodingHandlerPtr)0x0) {
        xmlSwitchToEncoding(ctxt,handler);
        return ctxt;
      }
    }
    else {
      xmlSwitchEncoding(ctxt,enc);
      if (ctxt->errNo != 0x20) {
        return ctxt;
      }
    }
    htmlParseErr(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding %s\n",(xmlChar *)encoding,
                 (xmlChar *)0x0);
  }
  return ctxt;
}

Assistant:

static htmlParserCtxtPtr
htmlCreateDocParserCtxt(const xmlChar *cur, const char *encoding) {
    int len;
    htmlParserCtxtPtr ctxt;

    if (cur == NULL)
	return(NULL);
    len = xmlStrlen(cur);
    ctxt = htmlCreateMemoryParserCtxt((char *)cur, len);
    if (ctxt == NULL)
	return(NULL);

    if (encoding != NULL) {
	xmlCharEncoding enc;
	xmlCharEncodingHandlerPtr handler;

	if (ctxt->input->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->input->encoding);
	ctxt->input->encoding = xmlStrdup((const xmlChar *) encoding);

	enc = xmlParseCharEncoding(encoding);
	/*
	 * registered set of known encodings
	 */
	if (enc != XML_CHAR_ENCODING_ERROR) {
	    xmlSwitchEncoding(ctxt, enc);
	    if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
		htmlParseErr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
		             "Unsupported encoding %s\n",
			     (const xmlChar *) encoding, NULL);
	    }
	} else {
	    /*
	     * fallback for unknown encodings
	     */
	    handler = xmlFindCharEncodingHandler((const char *) encoding);
	    if (handler != NULL) {
		xmlSwitchToEncoding(ctxt, handler);
	    } else {
		htmlParseErr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
		             "Unsupported encoding %s\n",
			     (const xmlChar *) encoding, NULL);
	    }
	}
    }
    return(ctxt);
}